

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorText.cpp
# Opt level: O2

void __thiscall Rml::DecoratorText::~DecoratorText(DecoratorText *this)

{
  (this->super_Decorator)._vptr_Decorator = (_func_int **)&PTR__DecoratorText_00397090;
  ::std::__cxx11::string::~string((string *)&this->text);
  Decorator::~Decorator(&this->super_Decorator);
  return;
}

Assistant:

DecoratorText::~DecoratorText() {}